

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O3

int Msat_SolverParseDimacs(FILE *pFile,Msat_Solver_t **p,int fVerbose)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte *__ptr;
  Msat_Solver_t *p_00;
  Msat_IntVec_t *p_01;
  byte *pbVar7;
  byte *local_48;
  int local_3c;
  Msat_Solver_t **local_38;
  
  p_01 = (Msat_IntVec_t *)0x0;
  local_3c = fVerbose;
  local_38 = p;
  fseek((FILE *)pFile,0,2);
  lVar6 = ftell((FILE *)pFile);
  rewind((FILE *)pFile);
  __ptr = (byte *)malloc((lVar6 << 0x20) + 0x300000000 >> 0x20);
  fread(__ptr,(long)(int)lVar6,1,(FILE *)pFile);
  __ptr[(int)lVar6] = 10;
  __ptr[(lVar6 << 0x20) + 0x100000000 >> 0x20] = 0;
  p_00 = (Msat_Solver_t *)0x0;
  local_48 = __ptr;
  pbVar7 = __ptr;
LAB_00501c20:
  do {
    while( true ) {
      pbVar7 = pbVar7 + 1;
      bVar2 = *local_48;
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) break;
      local_48 = local_48 + 1;
    }
    if (bVar2 == 99) {
      while (local_48 = pbVar7, bVar2 != 0) {
        pbVar7 = local_48;
        if (bVar2 == 10) goto LAB_00501c20;
        pbVar7 = local_48 + 1;
        bVar2 = *local_48;
      }
      local_48 = local_48 + -1;
      pbVar7 = local_48;
      goto LAB_00501c20;
    }
    if (bVar2 == 0) {
      Msat_IntVecFree(p_01);
      *local_38 = p_00;
      iVar5 = Msat_SolverSimplifyDB(p_00);
      goto LAB_00501da3;
    }
    if (bVar2 == 0x70) {
      for (; (bVar2 = *pbVar7, bVar2 - 9 < 5 || (bVar2 == 0x20)); pbVar7 = pbVar7 + 1) {
      }
      while ((0x20 < bVar2 || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
        bVar2 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
      }
      local_48 = pbVar7;
      iVar5 = Msat_ReadInt((char **)&local_48);
      Msat_ReadInt((char **)&local_48);
      do {
        bVar2 = *local_48;
        pbVar7 = local_48;
        if (bVar2 == 0) break;
        local_48 = local_48 + 1;
        pbVar7 = local_48;
      } while (bVar2 != 10);
      local_48 = pbVar7;
      p_00 = Msat_SolverAlloc(iVar5,1.0,1.0,1.0,1.0,0);
      Msat_SolverClean(p_00,iVar5);
      Msat_SolverSetVerbosity(p_00,local_3c);
      p_01 = Msat_IntVecAlloc(iVar5);
      local_48 = pbVar7;
    }
    else {
      if (p_00 == (Msat_Solver_t *)0x0) {
        puts("There is no parameter line.");
LAB_00501dd1:
        exit(1);
      }
      uVar3 = Msat_SolverReadVarNum(p_00);
      Msat_IntVecClear(p_01);
      while (uVar4 = Msat_ReadInt((char **)&local_48), uVar4 != 0) {
        uVar1 = -uVar4;
        if (0 < (int)uVar4) {
          uVar1 = uVar4;
        }
        if ((int)uVar3 < (int)uVar1) {
          printf("Variable %d is larger than the number of allocated variables (%d).\n",(ulong)uVar1
                 ,(ulong)uVar3);
          goto LAB_00501dd1;
        }
        Msat_IntVecPush(p_01,(uint)((int)uVar4 < 1) + uVar1 * 2 + -2);
      }
      iVar5 = Msat_SolverAddClause(p_00,p_01);
      pbVar7 = local_48;
      if (iVar5 == 0) {
        iVar5 = 0;
LAB_00501da3:
        if (__ptr != (byte *)0x0) {
          free(__ptr);
        }
        return iVar5;
      }
    }
  } while( true );
}

Assistant:

int  Msat_SolverParseDimacs( FILE * pFile, Msat_Solver_t ** p, int fVerbose )
{
    char * pText;
    int  Value;
    pText = Msat_FileRead( pFile );
    Value = Msat_ReadDimacs( pText, p, fVerbose );
    ABC_FREE( pText );
    return Value;
}